

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# abcPrint.c
# Opt level: O0

void Abc_Show6VarFunc(word F0,word F1)

{
  undefined8 uVar1;
  int local_44;
  int local_40;
  int v;
  int h;
  int s;
  int Cells [8];
  word F1_local;
  word F0_local;
  
  _h = 0x400000000;
  Cells[0] = 6;
  Cells[1] = 2;
  Cells[2] = 3;
  Cells[3] = 7;
  Cells[4] = 5;
  Cells[5] = 1;
  Cells._24_8_ = F1;
  if ((F0 & F1) == 0) {
    for (v = 0; v < 4; v = v + 1) {
      printf(" ");
    }
    printf(" ");
    for (local_40 = 0; local_40 < 8; local_40 = local_40 + 1) {
      for (v = 0; v < 3; v = v + 1) {
        printf("%d",(ulong)((&h)[local_40] >> (2U - (char)v & 0x1f) & 1));
      }
      printf(" ");
    }
    printf("\n");
    for (v = 0; v < 4; v = v + 1) {
      printf(" ");
    }
    printf("+");
    for (local_40 = 0; local_40 < 8; local_40 = local_40 + 1) {
      for (v = 0; v < 3; v = v + 1) {
        printf("-");
      }
      printf("+");
    }
    printf("\n");
    for (local_44 = 0; local_44 < 8; local_44 = local_44 + 1) {
      for (v = 0; v < 3; v = v + 1) {
        printf("%d",(ulong)((&h)[local_44] >> (2U - (char)v & 0x1f) & 1));
      }
      printf(" |");
      for (local_40 = 0; local_40 < 8; local_40 = local_40 + 1) {
        printf(" ");
        if ((F0 >> ((char)(&h)[local_44] * '\b' + (char)(&h)[local_40] & 0x3fU) & 1) == 0) {
          if (((ulong)Cells._24_8_ >> ((char)(&h)[local_44] * '\b' + (char)(&h)[local_40] & 0x3fU) &
              1) == 0) {
            printf(" ");
          }
          else {
            printf("1");
          }
        }
        else {
          printf("0");
        }
        printf(" |");
      }
      printf("\n");
      for (v = 0; v < 4; v = v + 1) {
        printf(" ");
      }
      printf("+");
      for (local_40 = 0; local_40 < 8; local_40 = local_40 + 1) {
        for (v = 0; v < 3; v = v + 1) {
          printf("-");
        }
        uVar1 = 0x7c;
        if (local_44 == 7 || local_40 == 7) {
          uVar1 = 0x2b;
        }
        printf("%c",uVar1);
      }
      printf("\n");
    }
    return;
  }
  __assert_fail("(F0 & F1) == 0",
                "/workspace/llm4binary/github/license_c_cmakelists/topjohnwu[P]CAD-Contest-NP3/src/base/abci/abcPrint.c"
                ,0x732,"void Abc_Show6VarFunc(word, word)");
}

Assistant:

void Abc_Show6VarFunc( word F0, word F1 )
{
    // order of cells in the Karnaugh map
//    int Cells[8] = { 0, 1, 3, 2, 6, 7, 5, 4 };
    int Cells[8] = { 0, 4, 6, 2, 3, 7, 5, 1 };
    // intermediate variables
    int s; // symbol counter
    int h; // horizontal coordinate;
    int v; // vertical coordinate;
    assert( (F0 & F1) == 0 );

    // output minterms above
    for ( s = 0; s < 4; s++ )
        printf( " " );
    printf( " " );
    for ( h = 0; h < 8; h++ )
    {
        for ( s = 0; s < 3; s++ )
            printf( "%d",  ((Cells[h] >> (2-s)) & 1) );
        printf( " " );
    }
    printf( "\n" );

    // output horizontal line above
    for ( s = 0; s < 4; s++ )
        printf( " " );
    printf( "+" );
    for ( h = 0; h < 8; h++ )
    {
        for ( s = 0; s < 3; s++ )
            printf( "-" );
        printf( "+" );
    }
    printf( "\n" );

    // output lines with function values
    for ( v = 0; v < 8; v++ )
    {
        for ( s = 0; s < 3; s++ )
            printf( "%d",  ((Cells[v] >> (2-s)) & 1) );
        printf( " |" );

        for ( h = 0; h < 8; h++ )
        {
            printf( " " );
            if ( ((F0 >> ((Cells[v]*8)+Cells[h])) & 1) )
                printf( "0" );
            else if ( ((F1 >> ((Cells[v]*8)+Cells[h])) & 1) )
                printf( "1" );
            else
                printf( " " );
            printf( " |" );
        }
        printf( "\n" );

        // output horizontal line above
        for ( s = 0; s < 4; s++ )
            printf( " " );
//        printf( "%c", v == 7 ? '+' : '|' );
        printf( "+" );
        for ( h = 0; h < 8; h++ )
        {
            for ( s = 0; s < 3; s++ )
                printf( "-" );
//            printf( "%c", v == 7 ? '+' : '|' );
            printf( "%c", (v == 7 || h == 7) ? '+' : '|' );
        }
        printf( "\n" );
    }
}